

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ym2612.cpp
# Opt level: O3

int __thiscall LibGens::Ym2612::reInit(Ym2612 *this,int clock,int rate)

{
  Ym2612Private *pYVar1;
  long lVar2;
  uint (*pauVar3) [32];
  uint *puVar4;
  undefined1 *puVar5;
  long lVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  double dVar16;
  double dVar17;
  int iVar18;
  int iVar19;
  double dVar20;
  undefined1 auVar21 [16];
  double dVar22;
  double dVar23;
  undefined1 auVar24 [16];
  double dVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  
  if (rate < 1) {
    __assert_fail("rate > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libOPNMIDI/src/chips/gens/Ym2612.cpp"
                  ,0x605,"int LibGens::Ym2612::reInit(int, int)");
  }
  if (rate < clock) {
    memset(&this->d->state,0,0x11b8);
    pYVar1 = this->d;
    (pYVar1->state).Clock = clock;
    (pYVar1->state).Rate = rate;
    dVar7 = ((double)clock / (double)rate) / 144.0;
    (pYVar1->state).Frequence = dVar7;
    (pYVar1->state).TimerBase = (int)(dVar7 * 4096.0);
    uVar10 = 0x4000;
    if ((this->m_improved == true) && (1.0 < dVar7)) {
      uVar10 = (uint)(long)((1.0 / dVar7) * 16384.0);
      (pYVar1->state).Rate = (int)((double)clock / 144.0);
      (pYVar1->state).Frequence = 1.0;
      dVar7 = 1.0;
    }
    (pYVar1->state).Inter_Step = uVar10;
    (pYVar1->state).Inter_Cnt = 0;
    auVar9 = _DAT_001b26a0;
    lVar2 = 0;
    dVar16 = (double)DAT_001b26a0;
    dVar17 = DAT_001b26a0._8_8_;
    auVar21 = _DAT_001b2690;
    do {
      uVar10 = auVar21._8_4_;
      auVar24._4_4_ = 0;
      auVar24._0_4_ = uVar10;
      iVar15 = auVar21._12_4_;
      auVar24._8_4_ = iVar15;
      auVar24._12_4_ = 0;
      auVar24 = auVar24 | auVar9;
      iVar14 = auVar21._4_4_;
      auVar31._0_4_ = auVar21._0_4_;
      auVar31._4_4_ = 0;
      auVar31._8_4_ = iVar14;
      auVar31._12_4_ = 0;
      auVar21 = auVar31 | auVar9;
      dVar20 = (auVar21._0_8_ - dVar16) * dVar7 * 4096.0 * 0.5;
      dVar22 = (auVar21._8_8_ - dVar17) * dVar7 * 4096.0 * 0.5;
      dVar23 = (auVar24._0_8_ - dVar16) * dVar7 * 4096.0 * 0.5;
      dVar25 = (auVar24._8_8_ - dVar17) * dVar7 * 4096.0 * 0.5;
      iVar26 = (int)dVar23;
      iVar28 = (int)dVar25;
      iVar27 = (int)dVar20;
      iVar29 = (int)dVar22;
      *(ulong *)(pYVar1->FINC_TAB + lVar2) =
           CONCAT44((int)(dVar22 - 2147483648.0),(int)(dVar20 - 2147483648.0)) &
           CONCAT44(iVar29 >> 0x1f,iVar27 >> 0x1f) | CONCAT44(iVar29,iVar27);
      *(ulong *)(pYVar1->FINC_TAB + lVar2 + 2) =
           CONCAT44((int)(dVar25 - 2147483648.0),(int)(dVar23 - 2147483648.0)) &
           CONCAT44(iVar28 >> 0x1f,iVar26 >> 0x1f) | CONCAT44(iVar28,iVar26);
      lVar2 = lVar2 + 4;
      auVar21._0_4_ = auVar31._0_4_ + 4;
      auVar21._4_4_ = iVar14 + 4;
      auVar21._8_4_ = uVar10 + 4;
      auVar21._12_4_ = iVar15 + 4;
    } while (lVar2 != 0x800);
    pYVar1->AR_TAB[0] = 0;
    pYVar1->AR_TAB[1] = 0;
    pYVar1->AR_TAB[2] = 0;
    pYVar1->AR_TAB[3] = 0;
    pYVar1->DR_TAB[0] = 0;
    pYVar1->DR_TAB[1] = 0;
    pYVar1->DR_TAB[2] = 0;
    auVar21 = _DAT_001ec8d0;
    auVar9 = _DAT_001ec8c0;
    pYVar1->DR_TAB[3] = 0;
    uVar10 = 0;
    uVar11 = 1;
    uVar12 = 2;
    uVar13 = 3;
    lVar2 = 0;
    do {
      auVar32._0_8_ =
           (double)(int)(float)((uVar10 >> 2) * 0x800000 + 0x3f800000) * dVar7 * 1.0 * 268435456.0;
      auVar32._8_8_ =
           (double)(int)(float)((uVar11 >> 2) * 0x800000 + 0x3f800000) *
           ((double)(uVar11 & 3) * 0.25 + 1.0) * dVar7 * 268435456.0;
      auVar30._0_8_ =
           (double)(int)(float)((uVar12 >> 2) * 0x800000 + 0x3f800000) *
           ((double)(uVar12 & 3) * 0.25 + 1.0) * dVar7 * 268435456.0;
      auVar30._8_8_ =
           (double)(int)(float)((uVar13 >> 2) * 0x800000 + 0x3f800000) *
           ((double)(uVar13 & 3) * 0.25 + 1.0) * dVar7 * 268435456.0;
      auVar34._8_8_ = auVar30._8_8_;
      auVar34._0_8_ = auVar30._0_8_;
      auVar33._8_8_ = auVar32._8_8_;
      auVar33._0_8_ = auVar32._0_8_;
      auVar33 = divpd(auVar33,auVar9);
      iVar26 = (int)auVar33._0_8_;
      iVar29 = (int)auVar33._8_8_;
      auVar34 = divpd(auVar34,auVar9);
      iVar14 = (int)auVar34._0_8_;
      iVar15 = (int)auVar34._8_8_;
      auVar24 = divpd(auVar32,auVar21);
      iVar27 = (int)auVar24._0_8_;
      iVar18 = (int)auVar24._8_8_;
      auVar31 = divpd(auVar30,auVar21);
      iVar28 = (int)auVar31._0_8_;
      iVar19 = (int)auVar31._8_8_;
      *(ulong *)(pYVar1->AR_TAB + lVar2 + 4) =
           CONCAT44((int)(auVar33._8_8_ - 2147483648.0),(int)(auVar33._0_8_ - 2147483648.0)) &
           CONCAT44(iVar29 >> 0x1f,iVar26 >> 0x1f) | CONCAT44(iVar29,iVar26);
      *(ulong *)(pYVar1->AR_TAB + lVar2 + 4 + 2) =
           CONCAT44((int)(auVar34._8_8_ - 2147483648.0),(int)(auVar34._0_8_ - 2147483648.0)) &
           CONCAT44(iVar15 >> 0x1f,iVar14 >> 0x1f) | CONCAT44(iVar15,iVar14);
      *(ulong *)(pYVar1->DR_TAB + lVar2 + 4) =
           CONCAT44((int)(auVar24._8_8_ - 2147483648.0),(int)(auVar24._0_8_ - 2147483648.0)) &
           CONCAT44(iVar18 >> 0x1f,iVar27 >> 0x1f) | CONCAT44(iVar18,iVar27);
      *(ulong *)(pYVar1->DR_TAB + lVar2 + 4 + 2) =
           CONCAT44((int)(auVar31._8_8_ - 2147483648.0),(int)(auVar31._0_8_ - 2147483648.0)) &
           CONCAT44(iVar19 >> 0x1f,iVar28 >> 0x1f) | CONCAT44(iVar19,iVar28);
      lVar2 = lVar2 + 4;
      uVar10 = uVar10 + 4;
      uVar11 = uVar11 + 4;
      uVar12 = uVar12 + 4;
      uVar13 = uVar13 + 4;
    } while (lVar2 != 0x3c);
    uVar10 = pYVar1->AR_TAB[0x3f];
    lVar2 = 0;
    do {
      pYVar1->AR_TAB[lVar2 + 0x40] = uVar10;
      *(uint *)((long)(pYVar1->DT_TAB + -1) + lVar2 * 4) = pYVar1->DR_TAB[0x3f];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x20);
    pauVar3 = pYVar1->DT_TAB + 4;
    puVar5 = &Ym2612Private::DT_DEF_TAB;
    lVar2 = 0;
    do {
      lVar6 = 0;
      do {
        dVar16 = (double)(byte)puVar5[lVar6] * dVar7 * 32.0;
        pauVar3[-4][lVar6] = (int)dVar16;
        (*pauVar3)[lVar6] = (int)-dVar16;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x20);
      lVar2 = lVar2 + 1;
      puVar5 = puVar5 + 0x20;
      pauVar3 = pauVar3 + 1;
    } while (lVar2 != 4);
    puVar4 = pYVar1->LFO_INC_TAB;
    dVar7 = (double)((pYVar1->state).Inter_Step * (pYVar1->state).Rate >> 0xe);
    lVar2 = 0;
    do {
      auVar8._0_8_ = *(double *)((long)reInit::LFO_BITS + lVar2) * 268435456.0;
      auVar8._8_8_ = *(double *)((long)reInit::LFO_BITS + lVar2 + 8) * 268435456.0;
      auVar9._8_8_ = dVar7;
      auVar9._0_8_ = dVar7;
      auVar9 = divpd(auVar8,auVar9);
      iVar14 = (int)auVar9._0_8_;
      iVar15 = (int)auVar9._8_8_;
      *(ulong *)puVar4 =
           CONCAT44((int)(auVar9._8_8_ + -2147483648.0),(int)(auVar9._0_8_ + -2147483648.0)) &
           CONCAT44(iVar15 >> 0x1f,iVar14 >> 0x1f) | CONCAT44(iVar15,iVar14);
      lVar2 = lVar2 + 0x10;
      puVar4 = puVar4 + 2;
    } while (lVar2 != 0x40);
    reset(this);
    return 0;
  }
  __assert_fail("clock > rate",
                "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libOPNMIDI/src/chips/gens/Ym2612.cpp"
                ,0x606,"int LibGens::Ym2612::reInit(int, int)");
}

Assistant:

int Ym2612::reInit(int clock, int rate)
{
	assert(rate > 0);
	assert(clock > rate);
	if (rate <= 0 || clock <= rate)
		return -1;

	// Clear the state struct.
	memset(&d->state, 0, sizeof(d->state));
	d->state.Clock = clock;
	d->state.Rate = rate;

	// 144 = 12 * (prescale * 2) = 12 * 6 * 2
	// prescale set to 6 by default

	d->state.Frequence = ((double)(d->state.Clock) / (double)(d->state.Rate)) / 144.0;
	d->state.TimerBase = (int)(d->state.Frequence * 4096.0);

	if (m_improved && (d->state.Frequence > 1.0)) {
		d->state.Inter_Step = (unsigned int)((1.0 / d->state.Frequence) * (double)(0x4000));
		d->state.Inter_Cnt = 0;

		// We recalculate rate and frequence after interpolation
		d->state.Rate = (int)(d->state.Clock / 144.0);
		d->state.Frequence = 1.0;
	} else {
		// No interpolation.
		d->state.Inter_Step = 0x4000;
		d->state.Inter_Cnt = 0;
	}

//	LOG_MSG(ym2612, LOG_MSG_LEVEL_DEBUG2,
//		"YM2612 frequency = %g, rate = %d, interp step = %.8X",
//		d->state.Frequence, d->state.Rate, d->state.Inter_Step);

	// Frequency Step table.
	for (int i = 0; i < 2048; i++) {
		double x = (double)(i) * d->state.Frequence;
		#if ((SIN_LBITS + SIN_HBITS - (21 - 7)) < 0)
			x /= (double) (1 << ((21 - 7) - SIN_LBITS - SIN_HBITS));
		#else
			x *= (double) (1 << (SIN_LBITS + SIN_HBITS - (21 - 7)));
		#endif
		x /= 2.0;			// because MUL = value * 2
		d->FINC_TAB[i] = (unsigned int)x;
	}

	// Attack and Decay Rate tables.
	// Entries 0-3 are always 0.
	for (int i = 0; i < 4; i++) {
		d->AR_TAB[i] = 0;
		d->DR_TAB[i] = 0;
	}

	// Attack and Decay Rate tables.
	// Calculate entries 32-63.
	for (int i = 0; i < 60; i++) {
		double x = d->state.Frequence;

		x *= 1.0 + ((i & 3) * 0.25);		 // bits 0-1 : x1.00, x1.25, x1.50, x1.75
		x *= (double) (1 << ((i >> 2)));	 // bits 2-5 : shift bits (x2^0 - x2^15)
		x *= (double) (d->ENV_LENGTH << ENV_LBITS); // on ajuste pour le tableau ENV_TAB

		d->AR_TAB[i + 4] = (unsigned int) (x / d->AR_RATE);
		d->DR_TAB[i + 4] = (unsigned int) (x / d->DR_RATE);
	}

	// Attack and Decay Rate tables.
	// Entries 64-95 are copies of entry 63.
	for (int i = 64; i < 96; i++) {
		d->AR_TAB[i] = d->AR_TAB[63];
		d->DR_TAB[i] = d->DR_TAB[63];
	}

	// Detune table.
	for (int i = 0; i < 4; i++) {
		for (int j = 0; j < 32; j++) {
			double x;
			#if ((SIN_LBITS + SIN_HBITS - 21) < 0)
				x = (double)d->DT_DEF_TAB[i][j] * d->state.Frequence /
				    (double)(1 << (21 - SIN_LBITS - SIN_HBITS));
			#else
				x = (double)d->DT_DEF_TAB[i][j] * d->state.Frequence *
				    (double)(1 << (SIN_LBITS + SIN_HBITS - 21));
			#endif

			d->DT_TAB[i + 0][j] = (int) x;
			d->DT_TAB[i + 4][j] = (int) -x;
		}
	}

	// LFO step table.
	// TODO: Move to a static class variable?
	static const double LFO_BITS[8] = {
		3.98, 5.56, 6.02, 6.37, 6.88, 9.63, 48.1, 72.2
	};

	double j = (d->state.Rate * d->state.Inter_Step) / 0x4000;
	for (int i = 0; i < 8; i++) {
		d->LFO_INC_TAB[i] = (unsigned int) (LFO_BITS[i] * (double) (1 << (LFO_HBITS + LFO_LBITS)) / j);
	}


	// Reset the YM2612.
	reset();
	return 0;
}